

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_tscpm(pel *dst,int i_dst,pel *src,pel *luma_nb,pel *luma_rec,int i_luma_rec,int uiWidth,
                int uiHeight,int bAbove,int bLeft,int bitDept)

{
  pel local_8068 [4];
  int tmp_stride;
  pel tmp_buf [32768];
  int local_60;
  int local_5c;
  int b_v;
  int a_v;
  int shift;
  int b_u;
  int a_u;
  int i_luma_rec_local;
  pel *luma_rec_local;
  pel *luma_nb_local;
  pel *src_local;
  pel *ppStack_28;
  int i_dst_local;
  pel *dst_local;
  
  b_u = i_luma_rec;
  _a_u = luma_rec;
  luma_rec_local = luma_nb;
  luma_nb_local = src;
  src_local._4_4_ = i_dst;
  ppStack_28 = dst;
  get_tscpm_params(&shift,&a_v,&local_5c,&local_60,&b_v,bAbove,bLeft,uiWidth,uiHeight,bitDept,src,
                   luma_nb);
  tscpm_linear_transform
            (_a_u,b_u,local_8068,uiWidth << 2,shift,a_v,local_5c,local_60,b_v,uiWidth << 1,
             uiHeight << 1,bitDept);
  down_sample_uv(uiWidth,uiHeight,bitDept,local_8068,uiWidth << 2,ppStack_28,src_local._4_4_);
  return;
}

Assistant:

void ipred_tscpm(pel *dst, int i_dst, pel *src, pel* luma_nb, pel *luma_rec, int i_luma_rec, int uiWidth, int uiHeight, int bAbove, int bLeft, int bitDept)
{
    int a_u, b_u, shift;   // parameters of Linear Model : a, b, shift
    int a_v, b_v;
    pel tmp_buf[MAX_CU_SIZE * MAX_CU_SIZE * 2];
    int tmp_stride = uiWidth * 2 * 2;

    get_tscpm_params(&a_u, &b_u, &a_v, &b_v, &shift, bAbove, bLeft, uiWidth, uiHeight, bitDept, src, luma_nb);
    tscpm_linear_transform(luma_rec, i_luma_rec, tmp_buf, tmp_stride, a_u, b_u, a_v, b_v, shift, uiWidth << 1, uiHeight << 1, bitDept);
    down_sample_uv(uiWidth, uiHeight, bitDept, tmp_buf, tmp_stride, dst, i_dst);
}